

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluFboRenderContext.cpp
# Opt level: O2

void __thiscall
glu::FboRenderContext::createFramebuffer(FboRenderContext *this,RenderConfig *config)

{
  int iVar1;
  deUint32 dVar2;
  int depthBits;
  int iVar3;
  undefined4 extraout_var;
  NotSupportedError *pNVar5;
  IVec4 IVar6;
  int local_9c;
  int local_8c;
  TextureFormat local_88;
  deUint32 local_7c;
  int maxSize;
  ChannelType CStack_74;
  int iStack_70;
  int iStack_6c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  int local_58;
  PixelFormat local_48;
  long lVar4;
  
  iVar1 = (*this->m_context->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  dVar2 = chooseColorFormat(config);
  local_7c = chooseDepthStencilFormat(config);
  local_9c = config->width;
  iVar1 = config->height;
  if ((0 < config->numSamples) && (*(long *)(lVar4 + 0x1240) == 0)) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&maxSize,"Multisample FBO is not supported",(allocator<char> *)&local_88);
    tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)&maxSize);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (dVar2 == 0) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&maxSize,"Unsupported color attachment format",(allocator<char> *)&local_88
              );
    tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)&maxSize);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (iVar1 == -1 || local_9c == -1) {
    _maxSize = (TextureFormat)((ulong)_maxSize & 0xffffffff00000000);
    (**(code **)(lVar4 + 0x868))(0x84e8,&maxSize);
    if (local_9c == -1) {
      local_9c = maxSize;
    }
    if (iVar1 == -1) {
      iVar1 = maxSize;
    }
  }
  local_88 = mapGLInternalFormat(dVar2);
  IVar6 = tcu::getTextureFormatBitDepth((tcu *)&maxSize,&local_88);
  local_48.redBits = maxSize;
  local_48.greenBits = CStack_74;
  local_48.blueBits = iStack_70;
  local_48.alphaBits = iStack_6c;
  (**(code **)(lVar4 + 0x6e8))(1,&this->m_colorBuffer,IVar6.m_data._8_8_);
  (**(code **)(lVar4 + 0xa0))(0x8d41,this->m_colorBuffer);
  if (config->numSamples < 1) {
    (**(code **)(lVar4 + 0x1238))(0x8d41,dVar2,local_9c,iVar1);
  }
  else {
    (**(code **)(lVar4 + 0x1240))(0x8d41,config->numSamples,dVar2,local_9c,iVar1);
  }
  depthBits = 0;
  (**(code **)(lVar4 + 0xa0))(0x8d41,0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  checkError(dVar2,"Creating color renderbuffer",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluFboRenderContext.cpp"
             ,0xfa);
  dVar2 = local_7c;
  local_8c = 0;
  if (local_7c != 0) {
    _maxSize = mapGLInternalFormat(local_7c);
    depthBits = getNumDepthBits((TextureFormat *)&maxSize);
    local_8c = getNumStencilBits((TextureFormat *)&maxSize);
    (**(code **)(lVar4 + 0x6e8))(1,&this->m_depthStencilBuffer);
    (**(code **)(lVar4 + 0xa0))(0x8d41,this->m_depthStencilBuffer);
    if (config->numSamples < 1) {
      (**(code **)(lVar4 + 0x1238))(0x8d41,dVar2,local_9c,iVar1);
    }
    else {
      (**(code **)(lVar4 + 0x1240))(0x8d41,config->numSamples,dVar2,local_9c,iVar1);
    }
    (**(code **)(lVar4 + 0xa0))(0x8d41,0);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    checkError(dVar2,"Creating depth / stencil renderbuffer",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluFboRenderContext.cpp"
               ,0x10a);
  }
  (**(code **)(lVar4 + 0x6d0))(1,&this->m_framebuffer);
  (**(code **)(lVar4 + 0x78))(0x8d40,this->m_framebuffer);
  if (this->m_colorBuffer != 0) {
    (**(code **)(lVar4 + 0x688))(0x8d40,0x8ce0,0x8d41);
  }
  if (this->m_depthStencilBuffer != 0) {
    if (0 < depthBits) {
      (**(code **)(lVar4 + 0x688))(0x8d40,0x8d00,0x8d41);
    }
    if (0 < local_8c) {
      (**(code **)(lVar4 + 0x688))(0x8d40,0x8d20,0x8d41,this->m_depthStencilBuffer);
    }
  }
  dVar2 = (**(code **)(lVar4 + 0x800))();
  checkError(dVar2,"Creating framebuffer",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluFboRenderContext.cpp"
             ,0x11c);
  iVar3 = (**(code **)(lVar4 + 0x170))(0x8d40);
  if (iVar3 != 0x8cd5) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&maxSize,"Framebuffer is not complete",(allocator<char> *)&local_88);
    tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)&maxSize);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar4 + 0x1a00))(0,0,local_9c,iVar1);
  tcu::RenderTarget::RenderTarget
            ((RenderTarget *)&maxSize,local_9c,iVar1,&local_48,depthBits,local_8c,config->numSamples
            );
  (this->m_renderTarget).m_numSamples = local_58;
  (this->m_renderTarget).m_pixelFormat.blueBits = local_68._M_allocated_capacity._0_4_;
  (this->m_renderTarget).m_pixelFormat.alphaBits = local_68._M_allocated_capacity._4_4_;
  (this->m_renderTarget).m_depthBits = local_68._8_4_;
  (this->m_renderTarget).m_stencilBits = local_68._12_4_;
  (this->m_renderTarget).m_width = maxSize;
  (this->m_renderTarget).m_height = CStack_74;
  (this->m_renderTarget).m_pixelFormat.redBits = iStack_70;
  (this->m_renderTarget).m_pixelFormat.greenBits = iStack_6c;
  return;
}

Assistant:

void FboRenderContext::createFramebuffer (const RenderConfig& config)
{
	DE_ASSERT(m_framebuffer == 0 && m_colorBuffer == 0 && m_depthStencilBuffer == 0);

	const glw::Functions&	gl					= m_context->getFunctions();
	const deUint32			colorFormat			= chooseColorFormat(config);
	const deUint32			depthStencilFormat	= chooseDepthStencilFormat(config);
	int						width				= config.width;
	int						height				= config.height;
	tcu::PixelFormat		pixelFormat;
	int						depthBits			= 0;
	int						stencilBits			= 0;

	if (config.numSamples > 0 && !gl.renderbufferStorageMultisample)
		throw tcu::NotSupportedError("Multisample FBO is not supported");

	if (colorFormat == 0)
		throw tcu::NotSupportedError("Unsupported color attachment format");

	if (width == glu::RenderConfig::DONT_CARE || height == glu::RenderConfig::DONT_CARE)
	{
		int maxSize = 0;
		gl.getIntegerv(GL_MAX_RENDERBUFFER_SIZE, &maxSize);

		width	= (width	== glu::RenderConfig::DONT_CARE) ? maxSize : width;
		height	= (height	== glu::RenderConfig::DONT_CARE) ? maxSize : height;
	}

	{
		pixelFormat = getPixelFormat(colorFormat);

		gl.genRenderbuffers(1, &m_colorBuffer);
		gl.bindRenderbuffer(GL_RENDERBUFFER, m_colorBuffer);

		if (config.numSamples > 0)
			gl.renderbufferStorageMultisample(GL_RENDERBUFFER, config.numSamples, colorFormat, width, height);
		else
			gl.renderbufferStorage(GL_RENDERBUFFER, colorFormat, width, height);

		gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Creating color renderbuffer");
	}

	if (depthStencilFormat != GL_NONE)
	{
		getDepthStencilBits(depthStencilFormat, &depthBits, &stencilBits);

		gl.genRenderbuffers(1, &m_depthStencilBuffer);
		gl.bindRenderbuffer(GL_RENDERBUFFER, m_depthStencilBuffer);

		if (config.numSamples > 0)
			gl.renderbufferStorageMultisample(GL_RENDERBUFFER, config.numSamples, depthStencilFormat, width, height);
		else
			gl.renderbufferStorage(GL_RENDERBUFFER, depthStencilFormat, width, height);

		gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Creating depth / stencil renderbuffer");
	}

	gl.genFramebuffers(1, &m_framebuffer);
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);

	if (m_colorBuffer)
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_colorBuffer);

	if (m_depthStencilBuffer)
	{
		if (depthBits > 0)
			gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, m_depthStencilBuffer);

		if (stencilBits > 0)
			gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, m_depthStencilBuffer);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Creating framebuffer");

	if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
		throw tcu::NotSupportedError("Framebuffer is not complete");

	// Set up correct viewport for first test case.
	gl.viewport(0, 0, width, height);

	m_renderTarget = tcu::RenderTarget(width, height, pixelFormat, depthBits, stencilBits, config.numSamples);
}